

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba_system.c
# Opt level: O1

void cleanup(EVP_PKEY_CTX *ctx)

{
  int i;
  long lVar1;
  
  free(mem->backup);
  free(mem->backup_path);
  lVar1 = 0;
  do {
    free(mem->savestate_path[lVar1]);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 10);
  free(mem->savestate_path);
  free(mem->rom);
  free(mem);
  mem = (gbamem_t *)0x0;
  free(ppu);
  ppu = (gba_ppu_t *)0x0;
  free(bus);
  bus = (gbabus_t *)0x0;
  free(apu);
  apu = (gba_apu_t *)0x0;
  free(cpu);
  cpu = (arm7tdmi_t *)0x0;
  return;
}

Assistant:

void cleanup() {
    free(mem->backup);
    free((void*)mem->backup_path);
    for (int i = 0; i < 10; i++) {
        free((void*)mem->savestate_path[i]);
    }
    free((void*)mem->savestate_path);
    free(mem->rom);
    free(mem);
    mem = NULL;

    free(ppu);
    ppu = NULL;
    free(bus);
    bus = NULL;
    free(apu);
    apu = NULL;
    free(cpu);
    cpu = NULL;
}